

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool dumpKeyPresses<short>(string *fname,TKeyPressCollectionT<short> *data)

{
  bool bVar1;
  reference psVar2;
  ostream *poVar3;
  undefined8 in_RSI;
  string *in_RDI;
  stKeyPressData<short> *k;
  const_iterator __end0;
  const_iterator __begin0;
  TKeyPressCollectionT<short> *__range1;
  ofstream fout;
  vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_> *in_stack_fffffffffffffda8;
  ostream *in_stack_fffffffffffffdb0;
  __normal_iterator<const_stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
  local_220;
  undefined8 local_218;
  ostream local_210 [512];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::ofstream::ofstream(local_210,in_RDI,_S_out);
  local_218 = local_10;
  local_220._M_current =
       (stKeyPressData<short> *)
       std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::begin
                 (in_stack_fffffffffffffda8);
  std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::end
            (in_stack_fffffffffffffda8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                        *)in_stack_fffffffffffffdb0,
                       (__normal_iterator<const_stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
                        *)in_stack_fffffffffffffda8);
    if (!bVar1) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<const_stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
             ::operator*(&local_220);
    poVar3 = (ostream *)std::ostream::operator<<(local_210,psVar2->pos);
    in_stack_fffffffffffffdb0 = std::operator<<(poVar3," 1");
    std::ostream::operator<<(in_stack_fffffffffffffdb0,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_stKeyPressData<short>_*,_std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>_>
    ::operator++(&local_220);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return true;
}

Assistant:

bool dumpKeyPresses(const std::string & fname, const TKeyPressCollectionT<T> & data) {
    std::ofstream fout(fname);
    for (auto & k : data) {
        fout << k.pos << " 1" << std::endl;
    }
    fout.close();
    return true;
}